

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O2

_Bool nni_id_visit(nni_id_map *m,uint64_t *keyp,void **valp,uint32_t *cursor)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  uint32_t uVar4;
  long lVar5;
  
  uVar3 = (ulong)*cursor;
  uVar1 = m->id_cap;
  lVar5 = uVar3 * 0x18;
  do {
    uVar4 = (uint32_t)uVar3;
    if (uVar1 <= uVar3) {
LAB_00110c64:
      *cursor = uVar4;
      return uVar3 < uVar1;
    }
    pvVar2 = *(void **)((long)&m->id_entries->val + lVar5);
    if (pvVar2 != (void *)0x0) {
      if (valp != (void **)0x0) {
        *valp = pvVar2;
      }
      if (keyp != (uint64_t *)0x0) {
        *keyp = *(uint64_t *)((long)&m->id_entries->key + lVar5);
      }
      uVar4 = uVar4 + 1;
      goto LAB_00110c64;
    }
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x18;
  } while( true );
}

Assistant:

bool
nni_id_visit(nni_id_map *m, uint64_t *keyp, void **valp, uint32_t *cursor)
{
	// cursor is just a cursor into the table
	uint32_t index = *cursor;
	while (index < m->id_cap) {
		if (m->id_entries[index].val != NULL) {
			if (valp != NULL) {
				*valp = m->id_entries[index].val;
			}
			if (keyp != NULL) {
				*keyp = m->id_entries[index].key;
			}
			*cursor = index + 1;
			return true;
		}
		index++;
	}
	*cursor = index;
	return (false);
}